

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O1

void __thiscall
AI::HierarchicalTaskNetworkComponent::initializeComponent(HierarchicalTaskNetworkComponent *this)

{
  vector<AI::FUtilityScores,_std::allocator<AI::FUtilityScores>_> *pvVar1;
  map<WorldStateIdentifier,_ValueOverTimeTracker,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_ValueOverTimeTracker>_>_>
  *this_00;
  ulong uVar2;
  HierarchicalTaskNetworkComponent *pHVar3;
  World *this_01;
  GameMode *this_02;
  TaskDatabase *this_03;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  mapped_type_conflict *pmVar6;
  mapped_type *pmVar7;
  _func_bool__Any_data_ptr_ValueOverTimeTracker_ptr *__tmp_1;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp;
  int iVar8;
  _Rb_tree_header *p_Var9;
  char *__end;
  WorldStateIdentifier local_7c;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type local_60;
  code *local_58;
  code *pcStack_50;
  code *local_48;
  HierarchicalTaskNetworkComponent *local_38;
  
  this_01 = Component::getWorld(&this->super_Component);
  this_02 = World::getAuthGameMode(this_01);
  GameMode::registerForFixedTicks(this_02,&this->super_IFixedTickable);
  local_38 = this;
  WorldQuerier::setup(&this->worldQuerySystem,this_01,(this->super_Component).owner);
  this_03 = GameMode::getAvailableTasks(this_02);
  p_Var5 = (this_03->considerations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var9 = &(this_03->considerations)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var9) {
    pvVar1 = &local_38->utilityScores;
    do {
      pmVar4 = std::
               map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
               ::operator[](&this_03->tasks,&p_Var5[1]._M_color);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_78._M_pod_data,(pmVar4->debugName)._M_dataplus._M_p,
                 (allocator<char> *)&local_7c);
      local_58 = (code *)0x0;
      pcStack_50 = (code *)0x0;
      local_48 = (code *)0x0;
      local_58 = (code *)operator_new(0x14);
      pcStack_50 = local_58 + 0x14;
      *(undefined8 *)local_58 = 0;
      *(undefined8 *)(local_58 + 8) = 0;
      *(undefined4 *)(local_58 + 0x10) = 0;
      local_48 = pcStack_50;
      std::vector<AI::FUtilityScores,_std::allocator<AI::FUtilityScores>_>::
      emplace_back<AI::FUtilityScores>(pvVar1,(FUtilityScores *)&local_78);
      if (local_58 != (code *)0x0) {
        operator_delete(local_58,(long)local_48 - (long)local_58);
      }
      if ((_Manager_type *)local_78._M_unused._0_8_ != &local_68) {
        operator_delete(local_78._M_unused._M_object,(ulong)(local_68 + 1));
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var9);
  }
  pHVar3 = local_38;
  uVar2 = (this_03->considerations)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if ((uVar2 < 5) && (iVar8 = (int)uVar2, iVar8 < 5)) {
    pvVar1 = &local_38->utilityScores;
    iVar8 = iVar8 + -5;
    do {
      local_78._M_unused._M_object = &local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"","");
      local_58 = (code *)0x0;
      pcStack_50 = (code *)0x0;
      local_48 = (code *)0x0;
      local_58 = (code *)operator_new(0x14);
      pcStack_50 = local_58 + 0x14;
      *(undefined8 *)local_58 = 0;
      *(undefined8 *)(local_58 + 8) = 0;
      *(undefined4 *)(local_58 + 0x10) = 0;
      local_48 = pcStack_50;
      std::vector<AI::FUtilityScores,_std::allocator<AI::FUtilityScores>_>::
      emplace_back<AI::FUtilityScores>(pvVar1,(FUtilityScores *)&local_78);
      if (local_58 != (code *)0x0) {
        operator_delete(local_58,(long)local_48 - (long)local_58);
      }
      if ((_Manager_type *)local_78._M_unused._0_8_ != &local_68) {
        operator_delete(local_78._M_unused._M_object,(ulong)(local_68 + 1));
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != 0);
  }
  local_78._0_4_ = 8;
  pmVar6 = std::
           map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
           ::operator[](&(pHVar3->state).current.values,(key_type *)local_78._M_pod_data);
  *pmVar6 = 0.0;
  this_00 = &(pHVar3->state).valueTrackers;
  local_7c = Alertness;
  ValueOverTimeTracker::ValueOverTimeTracker((ValueOverTimeTracker *)&local_78);
  std::
  _Rb_tree<WorldStateIdentifier,std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>,std::_Select1st<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>,std::less<WorldStateIdentifier>,std::allocator<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>>
  ::_M_emplace_unique<WorldStateIdentifier,ValueOverTimeTracker>
            ((_Rb_tree<WorldStateIdentifier,std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>,std::_Select1st<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>,std::less<WorldStateIdentifier>,std::allocator<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>>
              *)this_00,&local_7c,(ValueOverTimeTracker *)&local_78);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
  }
  local_7c = Alertness;
  pmVar7 = std::
           map<WorldStateIdentifier,_ValueOverTimeTracker,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_ValueOverTimeTracker>_>_>
           ::operator[](this_00,&local_7c);
  local_78._M_unused._0_8_ =
       (undefined8)
       *(undefined8 *)&(pmVar7->durationExceedsExtension).super__Function_base._M_functor;
  local_78._8_8_ =
       *(undefined8 *)
        ((long)&(pmVar7->durationExceedsExtension).super__Function_base._M_functor + 8);
  *(undefined8 *)&(pmVar7->durationExceedsExtension).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(pmVar7->durationExceedsExtension).super__Function_base._M_functor + 8) = 0
  ;
  local_68 = (pmVar7->durationExceedsExtension).super__Function_base._M_manager;
  (pmVar7->durationExceedsExtension).super__Function_base._M_manager =
       std::
       _Function_handler<bool_(ValueOverTimeTracker_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/HierarchicalTaskNetworkComponent.cpp:78:3)>
       ::_M_manager;
  local_60 = (pmVar7->durationExceedsExtension)._M_invoker;
  (pmVar7->durationExceedsExtension)._M_invoker =
       std::
       _Function_handler<bool_(ValueOverTimeTracker_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/HierarchicalTaskNetworkComponent.cpp:78:3)>
       ::_M_invoke;
  if (local_68 != (_Manager_type)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  local_7c = Curiosity;
  ValueOverTimeTracker::ValueOverTimeTracker((ValueOverTimeTracker *)&local_78);
  std::
  _Rb_tree<WorldStateIdentifier,std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>,std::_Select1st<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>,std::less<WorldStateIdentifier>,std::allocator<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>>
  ::_M_emplace_unique<WorldStateIdentifier,ValueOverTimeTracker>
            ((_Rb_tree<WorldStateIdentifier,std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>,std::_Select1st<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>,std::less<WorldStateIdentifier>,std::allocator<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>>
              *)this_00,&local_7c,(ValueOverTimeTracker *)&local_78);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
  }
  local_7c = Curiosity;
  pmVar7 = std::
           map<WorldStateIdentifier,_ValueOverTimeTracker,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_ValueOverTimeTracker>_>_>
           ::operator[](this_00,&local_7c);
  local_78._M_unused._0_8_ =
       (undefined8)
       *(undefined8 *)&(pmVar7->durationExceedsExtension).super__Function_base._M_functor;
  local_78._8_8_ =
       *(undefined8 *)
        ((long)&(pmVar7->durationExceedsExtension).super__Function_base._M_functor + 8);
  *(undefined8 *)&(pmVar7->durationExceedsExtension).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(pmVar7->durationExceedsExtension).super__Function_base._M_functor + 8) = 0
  ;
  local_68 = (pmVar7->durationExceedsExtension).super__Function_base._M_manager;
  (pmVar7->durationExceedsExtension).super__Function_base._M_manager =
       std::
       _Function_handler<bool_(ValueOverTimeTracker_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/HierarchicalTaskNetworkComponent.cpp:82:3)>
       ::_M_manager;
  local_60 = (pmVar7->durationExceedsExtension)._M_invoker;
  (pmVar7->durationExceedsExtension)._M_invoker =
       std::
       _Function_handler<bool_(ValueOverTimeTracker_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/HierarchicalTaskNetworkComponent.cpp:82:3)>
       ::_M_invoke;
  if (local_68 != (_Manager_type)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  local_7c = PlayerIdentified;
  ValueOverTimeTracker::ValueOverTimeTracker((ValueOverTimeTracker *)&local_78);
  std::
  _Rb_tree<WorldStateIdentifier,std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>,std::_Select1st<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>,std::less<WorldStateIdentifier>,std::allocator<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>>
  ::_M_emplace_unique<WorldStateIdentifier,ValueOverTimeTracker>
            ((_Rb_tree<WorldStateIdentifier,std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>,std::_Select1st<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>,std::less<WorldStateIdentifier>,std::allocator<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>>
              *)this_00,&local_7c,(ValueOverTimeTracker *)&local_78);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
  }
  (pHVar3->state).barker.barking = (pHVar3->barker).barking;
  (pHVar3->state).barker.timeRemaining = (pHVar3->barker).timeRemaining;
  std::__cxx11::string::_M_assign((string *)&(pHVar3->state).barker.speech);
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::initializeComponent()
{
	auto world = getWorld();
	auto gameMode = world->getAuthGameMode();
	gameMode->registerForFixedTicks(this);
	
	worldQuerySystem.setup(world, owner);

	auto& tasks = gameMode->getAvailableTasks();

	for (auto& kvp : tasks.considerations)
	{
		utilityScores.push_back({tasks.tasks[kvp.first].debugName.c_str(), std::vector<float>(5)});
	}

	if (tasks.considerations.size() < 5)
	{
		for (int j = tasks.considerations.size(); j < 5; j++)
		{
			utilityScores.push_back({"", std::vector<float>(5)});
		}
	}

	state.current.values[WorldStateIdentifier::Stance] = static_cast<float>(Stance::Standing);
	
	state.valueTrackers.emplace(WorldStateIdentifier::Alertness, ValueOverTimeTracker{});
	state.valueTrackers[WorldStateIdentifier::Alertness].durationExceedsExtension =
		[](auto& tracker) {return tracker.durationBelowValue > (tracker.maxValue / 8.f);};

	state.valueTrackers.emplace(WorldStateIdentifier::Curiosity, ValueOverTimeTracker{});
	state.valueTrackers[WorldStateIdentifier::Curiosity].durationExceedsExtension =
		[](auto& tracker) {return tracker.durationBelowValue > (tracker.maxValue / 8.f);};

	state.valueTrackers.emplace(WorldStateIdentifier::PlayerIdentified, ValueOverTimeTracker{});

	state.barker = barker;
}